

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_poller.cpp
# Opt level: O2

int __thiscall zmq::socket_poller_t::remove_fd(socket_poller_t *this,fd_t fd_)

{
  __normal_iterator<zmq::socket_poller_t::item_t_*,_std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>_>
  e_;
  int iVar1;
  __normal_iterator<zmq::socket_poller_t::item_t_*,_std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>_>
  __position;
  int *piVar2;
  _func_bool_item_t_ptr_int *in_RCX;
  fd_t fd__local;
  
  e_._M_current =
       (this->_items).
       super__Vector_base<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  __position = find_if2<__gnu_cxx::__normal_iterator<zmq::socket_poller_t::item_t*,std::vector<zmq::socket_poller_t::item_t,std::allocator<zmq::socket_poller_t::item_t>>>,int,bool(*)(zmq::socket_poller_t::item_t_const&,int)>
                         ((this->_items).
                          super__Vector_base<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,e_,&fd__local,in_RCX);
  if (__position._M_current == e_._M_current) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    iVar1 = -1;
  }
  else {
    std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>::erase
              (&this->_items,(const_iterator)__position._M_current);
    this->_need_rebuild = true;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int zmq::socket_poller_t::remove_fd (fd_t fd_)
{
    const items_t::iterator it =
      find_if2 (_items.begin (), _items.end (), fd_, &is_fd);

    if (it == _items.end ()) {
        errno = EINVAL;
        return -1;
    }

    _items.erase (it);
    _need_rebuild = true;

    return 0;
}